

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# single_value_test.cpp
# Opt level: O2

void testSingleValue_MultipleValueArguments_ShouldSucceed(void)

{
  bool bVar1;
  mapped_type *pmVar2;
  long lVar3;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_00;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_01;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_02;
  allocator<char> local_316;
  allocator<char> local_315;
  allocator<char> local_314;
  allocator<char> local_313;
  allocator_type local_312;
  allocator<char> local_311;
  Argengine ae;
  key_type local_308;
  string error;
  _Any_data local_2c8;
  code *local_2b8;
  code *local_2b0;
  _Any_data local_2a8;
  code *local_298;
  code *local_290;
  _Any_data local_288;
  code *local_278;
  code *local_270;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_268;
  string local_250 [32];
  string local_230 [32];
  string local_210 [32];
  string local_1f0 [32];
  string local_1d0 [32];
  string local_1b0 [32];
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_190;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_160;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_130;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  values;
  string local_c0 [32];
  string local_a0 [32];
  string local_80 [32];
  string local_60 [32];
  string local_40 [32];
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&values,"test",(allocator<char> *)&error);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&values._M_t._M_impl.super__Rb_tree_header._M_header._M_right,"-a",
             (allocator<char> *)&local_308);
  std::__cxx11::string::string<std::allocator<char>>(local_c0,"1",&local_316);
  std::__cxx11::string::string<std::allocator<char>>(local_a0,"-b",&local_313);
  std::__cxx11::string::string<std::allocator<char>>(local_80,"2",&local_314);
  std::__cxx11::string::string<std::allocator<char>>(local_60,"-c",&local_315);
  std::__cxx11::string::string<std::allocator<char>>(local_40,"3",&local_311);
  __l._M_len = 7;
  __l._M_array = (iterator)&values;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_268,__l,&local_312);
  juzzlin::Argengine::Argengine(&ae,&local_268,1);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_268);
  lVar3 = 0xc0;
  do {
    std::__cxx11::string::~string((string *)(&values._M_t._M_impl.field_0x0 + lVar3));
    lVar3 = lVar3 + -0x20;
  } while (lVar3 != -0x20);
  values._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &values._M_t._M_impl.super__Rb_tree_header._M_header;
  values._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  values._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  values._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  values._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       values._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&error,"-a",(allocator<char> *)&local_308);
  __l_00._M_len = 1;
  __l_00._M_array = &error;
  std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::set((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         *)&local_130,__l_00,
        (less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *)
        &local_316,(allocator_type *)&local_313);
  local_288._8_8_ = 0;
  local_270 = std::
              _Function_handler<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/juzzlin[P]Argengine/src/tests/single_value_test/single_value_test.cpp:179:28)>
              ::_M_invoke;
  local_278 = std::
              _Function_handler<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/juzzlin[P]Argengine/src/tests/single_value_test/single_value_test.cpp:179:28)>
              ::_M_manager;
  local_288._M_unused._M_object = (iterator)&values;
  std::__cxx11::string::string<std::allocator<char>>(local_1b0,"",&local_314);
  std::__cxx11::string::string<std::allocator<char>>(local_1d0,"VALUE",&local_315);
  juzzlin::Argengine::addOption(&ae,&local_130,&local_288,0,local_1b0,local_1d0);
  std::__cxx11::string::~string(local_1d0);
  std::__cxx11::string::~string(local_1b0);
  std::_Function_base::~_Function_base((_Function_base *)&local_288);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~_Rb_tree(&local_130);
  std::__cxx11::string::~string((string *)&error);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&error,"-b",(allocator<char> *)&local_308);
  __l_01._M_len = 1;
  __l_01._M_array = &error;
  std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::set((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         *)&local_160,__l_01,
        (less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *)
        &local_316,(allocator_type *)&local_313);
  local_2a8._8_8_ = 0;
  local_290 = std::
              _Function_handler<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/juzzlin[P]Argengine/src/tests/single_value_test/single_value_test.cpp:182:28)>
              ::_M_invoke;
  local_298 = std::
              _Function_handler<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/juzzlin[P]Argengine/src/tests/single_value_test/single_value_test.cpp:182:28)>
              ::_M_manager;
  local_2a8._M_unused._M_object = (iterator)&values;
  std::__cxx11::string::string<std::allocator<char>>(local_1f0,"",&local_314);
  std::__cxx11::string::string<std::allocator<char>>(local_210,"VALUE",&local_315);
  juzzlin::Argengine::addOption(&ae,&local_160,&local_2a8,0,local_1f0,local_210);
  std::__cxx11::string::~string(local_210);
  std::__cxx11::string::~string(local_1f0);
  std::_Function_base::~_Function_base((_Function_base *)&local_2a8);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~_Rb_tree(&local_160);
  std::__cxx11::string::~string((string *)&error);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&error,"-c",(allocator<char> *)&local_308);
  __l_02._M_len = 1;
  __l_02._M_array = &error;
  std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::set((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         *)&local_190,__l_02,
        (less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *)
        &local_316,(allocator_type *)&local_313);
  local_2c8._8_8_ = 0;
  local_2b0 = std::
              _Function_handler<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/juzzlin[P]Argengine/src/tests/single_value_test/single_value_test.cpp:185:28)>
              ::_M_invoke;
  local_2b8 = std::
              _Function_handler<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/juzzlin[P]Argengine/src/tests/single_value_test/single_value_test.cpp:185:28)>
              ::_M_manager;
  local_2c8._M_unused._M_object = (iterator)&values;
  std::__cxx11::string::string<std::allocator<char>>(local_230,"",&local_314);
  std::__cxx11::string::string<std::allocator<char>>(local_250,"VALUE",&local_315);
  juzzlin::Argengine::addOption(&ae,&local_190,&local_2c8,0,local_230,local_250);
  std::__cxx11::string::~string(local_250);
  std::__cxx11::string::~string(local_230);
  std::_Function_base::~_Function_base((_Function_base *)&local_2c8);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~_Rb_tree(&local_190);
  std::__cxx11::string::~string((string *)&error);
  error._M_dataplus._M_p = (pointer)&error.field_2;
  error._M_string_length = 0;
  error.field_2._M_local_buf[0] = '\0';
  juzzlin::Argengine::parse();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_308,"a",&local_316);
  pmVar2 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](&values,&local_308);
  bVar1 = std::operator==(pmVar2,"1");
  if (!bVar1) {
    __assert_fail("values[\"a\"] == \"1\"",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/juzzlin[P]Argengine/src/tests/single_value_test/single_value_test.cpp"
                  ,0xbe,"void testSingleValue_MultipleValueArguments_ShouldSucceed()");
  }
  std::__cxx11::string::~string((string *)&local_308);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_308,"b",&local_316);
  pmVar2 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](&values,&local_308);
  bVar1 = std::operator==(pmVar2,"2");
  if (!bVar1) {
    __assert_fail("values[\"b\"] == \"2\"",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/juzzlin[P]Argengine/src/tests/single_value_test/single_value_test.cpp"
                  ,0xbf,"void testSingleValue_MultipleValueArguments_ShouldSucceed()");
  }
  std::__cxx11::string::~string((string *)&local_308);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_308,"c",&local_316);
  pmVar2 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](&values,&local_308);
  bVar1 = std::operator==(pmVar2,"3");
  if (bVar1) {
    std::__cxx11::string::~string((string *)&local_308);
    std::__cxx11::string::~string((string *)&error);
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::~_Rb_tree(&values._M_t);
    juzzlin::Argengine::~Argengine(&ae);
    return;
  }
  __assert_fail("values[\"c\"] == \"3\"",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/juzzlin[P]Argengine/src/tests/single_value_test/single_value_test.cpp"
                ,0xc0,"void testSingleValue_MultipleValueArguments_ShouldSucceed()");
}

Assistant:

void testSingleValue_MultipleValueArguments_ShouldSucceed()
{
    Argengine ae({ "test", "-a", "1", "-b", "2", "-c", "3" });
    std::map<std::string, std::string> values;
    ae.addOption({ "-a" }, [&](std::string value) {
        values["a"] = value;
    });
    ae.addOption({ "-b" }, [&](std::string value) {
        values["b"] = value;
    });
    ae.addOption({ "-c" }, [&](std::string value) {
        values["c"] = value;
    });
    std::string error;
    ae.parse();
    assert(values["a"] == "1");
    assert(values["b"] == "2");
    assert(values["c"] == "3");
}